

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeListEditQual(AsciiParser *this,ListEditQual *qual)

{
  bool bVar1;
  uint64_t pos;
  uint64_t loc;
  string tok;
  ListEditQual *qual_local;
  AsciiParser *this_local;
  
  tok.field_2._8_8_ = qual;
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&loc);
    pos = CurrLoc(this);
    bVar1 = ReadIdentifier(this,(string *)&loc);
    if (bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&loc,"prepend");
      if (bVar1) {
        *(undefined4 *)tok.field_2._8_8_ = 4;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&loc,"append");
        if (bVar1) {
          *(undefined4 *)tok.field_2._8_8_ = 1;
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&loc,"add");
          if (bVar1) {
            *(undefined4 *)tok.field_2._8_8_ = 2;
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&loc,"delete");
            if (bVar1) {
              *(undefined4 *)tok.field_2._8_8_ = 3;
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&loc,"order");
              if (bVar1) {
                *(undefined4 *)tok.field_2._8_8_ = 5;
              }
              else {
                SeekTo(this,pos);
                *(undefined4 *)tok.field_2._8_8_ = 0;
              }
            }
          }
        }
      }
      bVar1 = SkipWhitespace(this);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      SeekTo(this,pos);
      this_local._7_1_ = false;
    }
    ::std::__cxx11::string::~string((string *)&loc);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::MaybeListEditQual(tinyusdz::ListEditQual *qual) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "prepend") {
    DCOUT("`prepend` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Prepend;
  } else if (tok == "append") {
    DCOUT("`append` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Append;
  } else if (tok == "add") {
    DCOUT("`add` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Add;
  } else if (tok == "delete") {
    DCOUT("`delete` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Delete;
  } else if (tok == "order") {
    DCOUT("`order` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Order;
  } else {
    DCOUT("No ListEdit qualifier.");
    // unqualified
    // rewind
    SeekTo(loc);
    (*qual) = tinyusdz::ListEditQual::ResetToExplicit;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}